

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

int Llb_NonlinStart(Llb_Mgr_t *p)

{
  void **ppvVar1;
  int iVar2;
  Vec_Ptr_t *__ptr;
  long lVar3;
  
  __ptr = Llb_NonlinBuildBdds(p->pAig,p->vLeaves,p->vRoots,p->dd);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = __ptr->nSize;
    if (0 < (long)iVar2) {
      ppvVar1 = __ptr->pArray;
      lVar3 = 0;
      do {
        Llb_NonlinAddPartition(p,(int)lVar3,(DdNode *)ppvVar1[lVar3]);
        lVar3 = lVar3 + 1;
      } while (iVar2 != lVar3);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Llb_NonlinStart( Llb_Mgr_t * p )
{
    Vec_Ptr_t * vRootBdds;
    DdNode * bFunc;
    int i;
    // create and collect BDDs
    vRootBdds = Llb_NonlinBuildBdds( p->pAig, p->vLeaves, p->vRoots, p->dd ); // come referenced
    if ( vRootBdds == NULL )
        return 0;
    // add pairs (refs are consumed inside)
    Vec_PtrForEachEntry( DdNode *, vRootBdds, bFunc, i )
        Llb_NonlinAddPartition( p, i, bFunc );
    Vec_PtrFree( vRootBdds );
    return 1;
}